

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_hash_join.cpp
# Opt level: O1

void __thiscall
duckdb::HashJoinGlobalSourceState::PrepareProbe
          (HashJoinGlobalSourceState *this,HashJoinGlobalSinkState *sink)

{
  pointer pPVar1;
  type pCVar2;
  idx_t iVar3;
  
  pPVar1 = unique_ptr<duckdb::JoinHashTable::ProbeSpill,_std::default_delete<duckdb::JoinHashTable::ProbeSpill>,_true>
           ::operator->(&sink->probe_spill);
  JoinHashTable::ProbeSpill::PrepareNextProbe(pPVar1);
  pPVar1 = unique_ptr<duckdb::JoinHashTable::ProbeSpill,_std::default_delete<duckdb::JoinHashTable::ProbeSpill>,_true>
           ::operator->(&sink->probe_spill);
  pCVar2 = unique_ptr<duckdb::ColumnDataConsumer,_std::default_delete<duckdb::ColumnDataConsumer>,_true>
           ::operator*(&pPVar1->consumer);
  iVar3 = pCVar2->collection->count;
  if (iVar3 != 0) {
    iVar3 = pCVar2->chunk_count;
  }
  LOCK();
  (this->probe_chunk_count).super___atomic_base<unsigned_long>._M_i = iVar3;
  UNLOCK();
  this->probe_chunk_done = 0;
  LOCK();
  (this->global_stage)._M_i = PROBE;
  UNLOCK();
  if ((this->probe_chunk_count).super___atomic_base<unsigned_long>._M_i != 0) {
    return;
  }
  TryPrepareNextStage(this,sink);
  return;
}

Assistant:

void HashJoinGlobalSourceState::PrepareProbe(HashJoinGlobalSinkState &sink) {
	sink.probe_spill->PrepareNextProbe();
	const auto &consumer = *sink.probe_spill->consumer;

	probe_chunk_count = consumer.Count() == 0 ? 0 : consumer.ChunkCount();
	probe_chunk_done = 0;

	global_stage = HashJoinSourceStage::PROBE;
	if (probe_chunk_count == 0) {
		TryPrepareNextStage(sink);
		return;
	}
}